

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O3

void __thiscall amrex::BaseFab<amrex::EBCellFlag>::define(BaseFab<amrex::EBCellFlag> *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  EBCellFlag *pEVar4;
  ulong uVar5;
  long lVar6;
  int iVar8;
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  long lVar10;
  
  if ((long)this->nvar == 0) {
    return;
  }
  lVar6 = (long)(((this->domain).bigend.vect[0] - (this->domain).smallend.vect[0]) + 1) *
          (long)this->nvar *
          (long)(((this->domain).bigend.vect[2] - (this->domain).smallend.vect[2]) + 1) *
          (long)(((this->domain).bigend.vect[1] - (this->domain).smallend.vect[1]) + 1);
  this->truesize = lVar6;
  this->ptr_owner = true;
  pEVar4 = (EBCellFlag *)DataAllocator::alloc(&this->super_DataAllocator,lVar6 * 4);
  this->dptr = pEVar4;
  auVar3 = _DAT_0065b9b0;
  lVar6 = this->truesize;
  if (0 < lVar6) {
    lVar10 = lVar6 + -1;
    auVar7._8_4_ = (int)lVar10;
    auVar7._0_8_ = lVar10;
    auVar7._12_4_ = (int)((ulong)lVar10 >> 0x20);
    uVar5 = 0;
    auVar7 = auVar7 ^ _DAT_0065b9b0;
    auVar9 = _DAT_0065f0d0;
    auVar11 = _DAT_0065b9a0;
    do {
      auVar12 = auVar11 ^ auVar3;
      iVar8 = auVar7._4_4_;
      if ((bool)(~(auVar12._4_4_ == iVar8 && auVar7._0_4_ < auVar12._0_4_ || iVar8 < auVar12._4_4_)
                & 1)) {
        pEVar4[uVar5].flag = 0xffffffe4;
      }
      if ((auVar12._12_4_ != auVar7._12_4_ || auVar12._8_4_ <= auVar7._8_4_) &&
          auVar12._12_4_ <= auVar7._12_4_) {
        pEVar4[uVar5 + 1].flag = 0xffffffe4;
      }
      auVar12 = auVar9 ^ auVar3;
      iVar13 = auVar12._4_4_;
      if (iVar13 <= iVar8 && (iVar13 != iVar8 || auVar12._0_4_ <= auVar7._0_4_)) {
        pEVar4[uVar5 + 2].flag = 0xffffffe4;
        pEVar4[uVar5 + 3].flag = 0xffffffe4;
      }
      uVar5 = uVar5 + 4;
      lVar10 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 4;
      auVar11._8_8_ = lVar10 + 4;
      lVar10 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 4;
      auVar9._8_8_ = lVar10 + 4;
    } while ((lVar6 + 3U & 0xfffffffffffffffc) != uVar5);
  }
  uVar1 = *(undefined8 *)(this->domain).bigend.vect;
  uVar2 = *(undefined8 *)(this->domain).smallend.vect;
  update_fab_stats((long)(((this->domain).bigend.vect[2] - (this->domain).smallend.vect[2]) + 1) *
                   (long)(((int)uVar1 - (int)uVar2) + 1) *
                   (long)(((int)((ulong)uVar1 >> 0x20) - (int)((ulong)uVar2 >> 0x20)) + 1),lVar6,4);
  return;
}

Assistant:

void
BaseFab<T>::define ()
{
    AMREX_ASSERT(this->dptr == 0);
    AMREX_ASSERT(this->domain.numPts() > 0);
    AMREX_ASSERT(this->nvar >= 0);
    if (this->nvar == 0) return;
    AMREX_ASSERT(std::numeric_limits<Long>::max()/this->nvar > this->domain.numPts());

    this->truesize  = this->nvar*this->domain.numPts();
    this->ptr_owner = true;
    this->dptr = static_cast<T*>(this->alloc(this->truesize*sizeof(T)));

    placementNew(this->dptr, this->truesize);

    amrex::update_fab_stats(this->domain.numPts(), this->truesize, sizeof(T));
}